

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void display_self(void)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  short sVar4;
  int y;
  int x;
  level *lev;
  uint trap;
  int iVar5;
  int obj_mn;
  int obj_stacks;
  int obj_prize;
  int monflags;
  
  lev = level;
  x = (int)u.ux;
  y = (int)u.uy;
  if (u.usteed == (monst *)0x0) {
LAB_00168f6b:
    if (youmonst.m_ap_type == '\x02') {
      iVar5 = youmonst.mappearance + 1;
      iVar3 = 0;
      obj_prize = 0;
      obj_stacks = 0;
      obj_mn = 0;
    }
    else {
      if (youmonst.m_ap_type == '\x01') {
        monflags = 0;
        iVar3 = 0;
        obj_prize = 0;
        obj_stacks = 0;
        obj_mn = 0;
        iVar5 = 0;
        trap = 0;
        uVar2 = youmonst.mappearance;
        goto LAB_001690a9;
      }
      uVar2 = youmonst.mappearance;
      if (youmonst.m_ap_type == '\0') {
        if ((u.umonnum == u.umonster) && (iflags.showrace != '\0')) {
          sVar4 = urace.femalenum;
          if (urace.femalenum == -1) {
            sVar4 = urace.malenum;
          }
          if (flags.female == '\0') {
            sVar4 = urace.malenum;
          }
          uVar2 = (uint)sVar4;
        }
        else {
          uVar2 = obfuscate_monster(u.umonnum);
        }
      }
      iVar3 = uVar2 + 1;
      obj_prize = -1;
      obj_stacks = -1;
      obj_mn = -1;
      iVar5 = -1;
    }
    monflags = 0;
    lev = level;
  }
  else {
    uVar2 = *(uint *)&(u.usteed)->field_0x60;
    if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_00168ef8;
      goto LAB_00168f6b;
    }
    if ((uVar2 & 0x280) != 0) goto LAB_00168f6b;
LAB_00168ef8:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_00168f6b;
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      iVar5 = monsndx((u.usteed)->data);
      iVar3 = obfuscate_monster(iVar5);
    }
    else {
      iVar3 = display_rng(0x193);
    }
    iVar3 = iVar3 + 1;
    obj_prize = -1;
    obj_stacks = -1;
    obj_mn = -1;
    iVar5 = -1;
    monflags = 2;
  }
  trap = 0xffffffff;
  uVar2 = trap;
LAB_001690a9:
  dbuf_set(lev,x,y,(rm *)0x0,uVar2,trap,iVar5,obj_mn,obj_stacks,obj_prize,0,iVar3,monflags,0);
  return;
}

Assistant:

void display_self(void)
{
    int x = u.ux, y = u.uy;
    
    if (u.usteed && mon_visible(u.usteed)) {
	dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1,
		 0, what_mon(obfuscate_monster(monsndx(u.usteed->data))) + 1,
		 MON_RIDDEN, 0);
    } else if (youmonst.m_ap_type == M_AP_NOTHING) {
	int monnum = (Upolyd || !iflags.showrace) ? obfuscate_monster(u.umonnum) :
	             (flags.female && urace.femalenum != NON_PM) ? urace.femalenum :
	             urace.malenum;
	dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1,
		 0, monnum + 1, 0, 0);
    } else if (youmonst.m_ap_type == M_AP_FURNITURE) {
	dbuf_set(level, x, y, NULL, youmonst.mappearance, 0, 0, 0, 0, 0,
		 0, 0, 0, 0);
    } else if (youmonst.m_ap_type == M_AP_OBJECT) {
	dbuf_set(level, x, y, NULL, -1, -1, youmonst.mappearance + 1, 0, 0, 0,
		 0, 0, 0, 0);
    } else /* M_AP_MONSTER */
	dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1,
		 0, youmonst.mappearance + 1, 0, 0);
}